

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8SourceInfo.h
# Opt level: O2

void __thiscall Js::Utf8SourceInfo::SetDebugDocument(Utf8SourceInfo *this,DebugDocument *document)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if ((this->m_debugDocument).ptr != (DebugDocument *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Base/Utf8SourceInfo.h"
                                ,0xdc,"(!HasDebugDocument())","!HasDebugDocument()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  Memory::WriteBarrierPtr<Js::DebugDocument>::WriteBarrierSet(&this->m_debugDocument,document);
  return;
}

Assistant:

void SetDebugDocument(DebugDocument * document)
        {
            Assert(!HasDebugDocument());
            m_debugDocument = document;
        }